

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O3

void __thiscall TinyGC::DetachCurrentThread(TinyGC *this)

{
  mapped_type pTVar1;
  pthread_t pVar2;
  mapped_type *ppTVar3;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lck;
  
  local_38 = (undefined1  [8])&this->ts_mxt_;
  lck._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_38);
  lck._M_device._0_1_ = 1;
  pVar2 = pthread_self();
  lck._8_8_ = pVar2;
  ppTVar3 = std::__detail::
            _Map_base<std::thread::id,_std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>,_std::__detail::_Select1st,_std::equal_to<std::thread::id>,_std::hash<std::thread::id>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::thread::id,_std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>,_std::__detail::_Select1st,_std::equal_to<std::thread::id>,_std::hash<std::thread::id>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->thread_to_stack_,(key_type *)&lck._M_owns);
  pTVar1 = *ppTVar3;
  lck._8_8_ = pVar2;
  std::
  _Hashtable<std::thread::id,_std::pair<const_std::thread::id,_TinyGC::ThreadState_*>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>,_std::__detail::_Select1st,_std::equal_to<std::thread::id>,_std::hash<std::thread::id>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->thread_to_stack_)._M_h);
  operator_delete(pTVar1,0x20);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return;
}

Assistant:

void TinyGC::DetachCurrentThread() {
  std::unique_lock<std::mutex> lck(ts_mxt_);
  ThreadState *ts = thread_to_stack_[std::this_thread::get_id()];
  thread_to_stack_.erase(std::this_thread::get_id());
  delete ts;
}